

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void G_DoNewGame(void)

{
  char *mapname;
  
  G_NewInit();
  playeringame[consoleplayer] = true;
  if (d_skill != -1) {
    FIntCVar::operator=(&gameskill,d_skill);
  }
  mapname = FString::operator_cast_to_char_(&d_mapname);
  G_InitNew(mapname,false);
  gameaction = ga_nothing;
  return;
}

Assistant:

void G_DoNewGame (void)
{
	G_NewInit ();
	playeringame[consoleplayer] = 1;
	if (d_skill != -1)
	{
		gameskill = d_skill;
	}
	G_InitNew (d_mapname, false);
	gameaction = ga_nothing;
}